

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

char * __thiscall
CVmImageFileExt::alloc_and_read
          (CVmImageFileExt *this,size_t len,uchar xor_mask,ulong remaining_in_page)

{
  char *buf;
  CVmFile *in_RCX;
  uchar in_DL;
  size_t in_RSI;
  size_t in_RDI;
  ulong in_stack_00000008;
  char *mem;
  
  buf = alloc_mem((CVmImageFileExt *)remaining_in_page,(size_t)mem,in_stack_00000008);
  if (buf == (char *)0x0) {
    err_throw(0);
  }
  CVmFile::read_bytes(in_RCX,buf,in_RDI);
  CVmImagePool::apply_xor_mask(buf,in_RSI,in_DL);
  return buf;
}

Assistant:

const char *CVmImageFileExt::alloc_and_read(size_t len, uchar xor_mask,
                                            ulong remaining_in_page)
{
    char *mem;
    
    /* allocate memory */
    mem = alloc_mem(len, remaining_in_page);
    if (mem == 0)
        err_throw(VMERR_OUT_OF_MEMORY);

    /* read the data */
    fp_->read_bytes(mem, len);

    /* if there's an XOR mask, apply it to each byte we read */
    CVmImagePool::apply_xor_mask(mem, len, xor_mask);

    /* return the memory block */
    return mem;
}